

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O1

void __thiscall ServerService::receiveBroadcast(ServerService *this,int port,char *message)

{
  int iVar1;
  ssize_t sVar2;
  size_t __n;
  socklen_t peerAddrLen;
  sockaddr_in ownAddr;
  sockaddr_in peerAddr;
  char peerName [30];
  char recvMsg [200];
  socklen_t local_14c;
  sockaddr local_148;
  char *local_130;
  sockaddr local_128;
  long local_118;
  undefined6 uStack_110;
  undefined2 local_10a;
  undefined6 uStack_108;
  undefined8 uStack_102;
  undefined1 local_f8 [200];
  
  memset(local_f8,0,200);
  local_14c = 0;
  uStack_108 = 0;
  uStack_102 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_10a = 0;
  local_148.sa_data[6] = '\0';
  local_148.sa_data[7] = '\0';
  local_148.sa_data[8] = '\0';
  local_148.sa_data[9] = '\0';
  local_148.sa_data[10] = '\0';
  local_148.sa_data[0xb] = '\0';
  local_148.sa_data[0xc] = '\0';
  local_148.sa_data[0xd] = '\0';
  local_128.sa_family = 0;
  local_128.sa_data[0] = '\0';
  local_128.sa_data[1] = '\0';
  local_128.sa_data[2] = '\0';
  local_128.sa_data[3] = '\0';
  local_128.sa_data[4] = '\0';
  local_128.sa_data[5] = '\0';
  local_128.sa_data[6] = '\0';
  local_128.sa_data[7] = '\0';
  local_128.sa_data[8] = '\0';
  local_128.sa_data[9] = '\0';
  local_128.sa_data[10] = '\0';
  local_128.sa_data[0xb] = '\0';
  local_128.sa_data[0xc] = '\0';
  local_128.sa_data[0xd] = '\0';
  local_148.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
  local_148.sa_family = 2;
  local_148.sa_data._2_4_ = 0;
  iVar1 = socket(2,2,0);
  this->broadcastFD = iVar1;
  if (iVar1 != -1) {
    iVar1 = bind(iVar1,&local_148,0x10);
    if (iVar1 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Bind Broadcast Address Fail",0x1b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
      std::ostream::put('`');
      std::ostream::flush();
    }
    else {
      local_130 = message;
      do {
        while( true ) {
          sVar2 = recvfrom(this->broadcastFD,local_f8,200,0,&local_128,&local_14c);
          if (0 < (int)sVar2) break;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Receive Broadcast Message Error",0x1f);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
          std::ostream::put('`');
          std::ostream::flush();
        }
        inet_ntop(2,local_128.sa_data + 2,(char *)&local_118,0x1e);
      } while (local_118 == 0x302e302e302e30);
      printf("Receive from %s, msg:%s\n",&local_118,local_f8);
      __n = strlen((char *)&local_118);
      memcpy(local_130,&local_118,__n);
      memset(local_f8,0,200);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Create Broadcast Sock Fail",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  return;
}

Assistant:

void ServerService::receiveBroadcast(int port, char* message) {
    struct sockaddr_in ownAddr, peerAddr;
    char recvMsg[200] = {0};
    socklen_t peerAddrLen = 0;
    char peerName[30] = {0};
    int ret = 0;

    bzero(&ownAddr, sizeof(struct sockaddr_in));
    bzero(&peerAddr, sizeof(struct sockaddr_in));
    ownAddr.sin_family = AF_INET;
    ownAddr.sin_port = htons(port);
    ownAddr.sin_addr.s_addr = htonl(INADDR_ANY);

    broadcastFD = socket(AF_INET, SOCK_DGRAM, 0);
    if (broadcastFD == -1) {
        cout << "Create Broadcast Sock Fail" << endl;
        return;
    }

    ret = bind(broadcastFD, (struct sockaddr *) &ownAddr, sizeof(struct sockaddr_in));
    if (ret == -1) {
        cout << "Bind Broadcast Address Fail" << endl;
        return;
    }

    while (true) {
        ret = recvfrom(broadcastFD, recvMsg, sizeof(recvMsg), 0, (struct sockaddr *) &peerAddr, &peerAddrLen);
        if (ret > 0) {
            inet_ntop(AF_INET, &peerAddr.sin_addr.s_addr, peerName, sizeof(peerName));
            if (!strcmp("0.0.0.0", peerName)) {
                continue;
            } else {
                printf("Receive from %s, msg:%s\n", peerName, recvMsg);
                memcpy(message, peerName, strlen(peerName));
                break;
            }
        } else {
            cout << "Receive Broadcast Message Error" << endl;
        }
    }
    bzero(recvMsg, sizeof(recvMsg));
}